

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseVanillaLayer.cpp
# Opt level: O0

void __thiscall DenseVanillaLayer::DenseVanillaLayer(DenseVanillaLayer *this,LayerMeta *meta)

{
  LayerMeta local_58;
  LayerMeta *local_18;
  LayerMeta *meta_local;
  DenseVanillaLayer *this_local;
  
  local_18 = meta;
  meta_local = (LayerMeta *)this;
  LayerMeta::LayerMeta(&local_58,meta);
  ILayer::ILayer(&this->super_ILayer,&local_58);
  LayerMeta::~LayerMeta(&local_58);
  (this->super_ILayer)._vptr_ILayer = (_func_int **)&PTR__DenseVanillaLayer_00143bb8;
  return;
}

Assistant:

DenseVanillaLayer::DenseVanillaLayer( LayerMeta meta ) : ILayer( std::move( meta )) { }